

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

void __thiscall
MutableS2ShapeIndex::AbsorbIndexCell
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,Iterator *iter,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker,EdgeAllocator *alloc)

{
  pointer *ppFVar1;
  undefined8 uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  pointer pFVar6;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> _Var7;
  FaceEdge *pFVar8;
  MutableS2ShapeIndex *pMVar9;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *pcVar10;
  bool bVar11;
  int iVar12;
  const_reference pvVar13;
  uint64 uVar14;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar15;
  pointer ppCVar16;
  long lVar17;
  ostream *poVar18;
  pointer ppCVar19;
  FaceEdge *pFVar20;
  ulong uVar21;
  undefined8 *puVar22;
  long lVar23;
  iterator __position;
  size_type_conflict n;
  byte bVar24;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *__range2;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  new_edges;
  ClippedEdge *clipped;
  FaceEdge edge;
  S2Point local_f8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  MutableS2ShapeIndex *local_c8;
  ulong local_c0;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *local_b8;
  long local_b0;
  ClippedEdge *local_a8;
  FaceEdge local_a0;
  S2Point *local_40;
  vector<MutableS2ShapeIndex::FaceEdge,std::allocator<MutableS2ShapeIndex::FaceEdge>> *local_38;
  
  bVar24 = 0;
  uVar21 = (pcell->id_).id_;
  if (uVar21 != (iter->super_IteratorBase).id_.id_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x4e7,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT44(local_a0._12_4_,local_a0.max_level),
               "Check failed: (pcell.id()) == (iter.id()) ",0x2a);
LAB_0019383f:
    abort();
  }
  if (((tracker->is_active_ == true) &&
      (ppCVar16 = (edges->
                  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
      ppCVar16 !=
      (edges->
      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      )._M_impl.super__Vector_impl_data._M_finish)) &&
     ((*ppCVar16)->face_edge->shape_id < this->pending_additions_begin_)) {
    if (uVar21 - (~uVar21 & uVar21 - 1) != (tracker->next_cellid_).id_) {
      S2PaddedCell::GetEntryVertex((S2Point *)&local_a0,pcell);
      (tracker->b_).c_[2] = local_a0.a.c_[0];
      (tracker->b_).c_[0] = (VType)local_a0._0_8_;
      (tracker->b_).c_[1] = (VType)CONCAT44(local_a0._12_4_,local_a0.max_level);
    }
    S2PaddedCell::GetExitVertex((S2Point *)&local_a0,pcell);
    InteriorTracker::DrawTo(tracker,(S2Point *)&local_a0);
    uVar5 = (pcell->id_).id_;
    uVar21 = uVar5 + (-uVar5 & uVar5) * 2;
    (tracker->next_cellid_).id_ = uVar21 - (~uVar21 & (uVar5 + (-uVar5 & uVar5) * 2) - 1);
    ppCVar19 = (edges->
               super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar16 = (edges->
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppCVar16 != ppCVar19;
        ppCVar16 = ppCVar16 + 1) {
      pFVar20 = (*ppCVar16)->face_edge;
      if (this->pending_additions_begin_ <= pFVar20->shape_id) break;
      if (pFVar20->has_interior == true) {
        InteriorTracker::TestEdge(tracker,pFVar20->shape_id,&pFVar20->edge);
      }
    }
  }
  InteriorTracker::SaveAndClearStateBefore(tracker,this->pending_additions_begin_);
  pFVar6 = (alloc->face_edges_).
           super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((alloc->face_edges_).
      super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar6) {
    (alloc->face_edges_).
    super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar6;
  }
  local_b8 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
             (iter->super_IteratorBase).cell_._M_b._M_p;
  local_c8 = this;
  if (((undefined1  [16])
       ((S2ClippedShapeSet *)&local_b8->field_0x0)->
       super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> &
      (undefined1  [16])0xffffff) == (undefined1  [16])0x0) {
    local_f8.c_[0] = 0.0;
    local_f8.c_[1] = 0.0;
    local_f8.c_[2] = 0.0;
  }
  else {
    local_38 = (vector<MutableS2ShapeIndex::FaceEdge,std::allocator<MutableS2ShapeIndex::FaceEdge>>
                *)&alloc->face_edges_;
    local_40 = &tracker->b_;
    local_c0 = 0;
    n = 0;
    do {
      pvVar13 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                          (local_b8,n);
      local_b0 = (long)pvVar13->shape_id_;
      _Var7._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
      super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
           (this->shapes_).
           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_b0]._M_t.
           super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t;
      if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
          _Var7._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
        uVar4 = *(uint *)&pvVar13->field_0x4;
        local_a0.edge.v1.c_[1] = 0.0;
        local_a0.edge.v1.c_[2] = 0.0;
        local_a0.edge.v0.c_[2] = 0.0;
        local_a0.edge.v1.c_[0] = 0.0;
        local_a0.edge.v0.c_[0] = 0.0;
        local_a0.edge.v0.c_[1] = 0.0;
        local_a0.b.c_[0] = 0.0;
        local_a0.b.c_[1] = 0.0;
        local_a0.a.c_[0] = 0.0;
        local_a0.a.c_[1] = 0.0;
        local_a0.shape_id =
             *(undefined4 *)
              ((long)_Var7._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                     super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 8);
        iVar12 = (**(code **)(*(long *)_Var7._M_t.
                                       super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>
                                       .super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x20)
                 )(_Var7._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                   super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl);
        local_a0.has_interior = iVar12 == 2;
        if (iVar12 == 2) {
          bVar3 = pvVar13->field_0x4;
          tracker->is_active_ = true;
          if ((bVar3 & 1) != 0) {
            InteriorTracker::ToggleShape(tracker,(int)local_b0);
          }
          if (uVar4 < 2 || (local_c0 & 1) != 0) goto LAB_0019340e;
          S2PaddedCell::GetCenter(&local_f8,pcell);
          local_40->c_[2] = local_f8.c_[2];
          local_40->c_[0] = local_f8.c_[0];
          local_40->c_[1] = local_f8.c_[1];
          S2PaddedCell::GetEntryVertex(&local_f8,pcell);
          InteriorTracker::DrawTo(tracker,&local_f8);
          uVar21 = (pcell->id_).id_;
          uVar14 = uVar21 - (~uVar21 & uVar21 - 1);
          (tracker->next_cellid_).id_ = uVar14;
          local_c0 = CONCAT71((int7)(uVar14 >> 8),1);
        }
        else {
LAB_0019340e:
          if (uVar4 < 2) goto LAB_00193601;
        }
        uVar21 = (ulong)(uVar4 >> 1);
        lVar23 = 0;
        do {
          paVar15 = &pvVar13->field_3;
          if (5 < *(uint *)&pvVar13->field_0x4) {
            paVar15 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar13->field_3).edges_;
          }
          local_a0.edge_id = *(undefined4 *)((long)paVar15 + lVar23);
          (**(code **)(*(long *)_Var7._M_t.
                                super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                                super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x18))
                    (&local_f8,
                     _Var7._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                     super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl);
          local_a0.edge.v1.c_[1] = local_d8;
          local_a0.edge.v1.c_[2] = dStack_d0;
          local_a0.edge.v0.c_[2] = local_f8.c_[2];
          local_a0.edge.v1.c_[0] = dStack_e0;
          local_a0.edge.v0.c_[0] = local_f8.c_[0];
          local_a0.edge.v0.c_[1] = local_f8.c_[1];
          local_a0.max_level =
               S2::Metric<1>::GetLevelForMaxValue
                         ((Metric<1> *)&S2::kAvgEdge,
                          SQRT((local_f8.c_[2] - dStack_d0) * (local_f8.c_[2] - dStack_d0) +
                               (local_f8.c_[1] - local_d8) * (local_f8.c_[1] - local_d8) +
                               (local_f8.c_[0] - dStack_e0) * (local_f8.c_[0] - dStack_e0)) *
                          FLAGS_s2shape_index_cell_size_to_long_edge_ratio);
          if (local_a0.has_interior == true) {
            InteriorTracker::TestEdge(tracker,(int32)local_b0,&local_a0.edge);
          }
          bVar11 = S2::ClipToPaddedFace
                             (&local_a0.edge.v0,&local_a0.edge.v1,(uint)((pcell->id_).id_ >> 0x3d),
                              kCellPadding,&local_a0.a,&local_a0.b);
          if (!bVar11) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)&local_f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                       ,0x536,kFatal,(ostream *)&std::cerr);
            std::operator<<((ostream *)local_f8.c_[1],"Invariant failure in MutableS2ShapeIndex");
            goto LAB_0019383f;
          }
          __position._M_current =
               (alloc->face_edges_).
               super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (alloc->face_edges_).
              super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<MutableS2ShapeIndex::FaceEdge,std::allocator<MutableS2ShapeIndex::FaceEdge>>
            ::_M_realloc_insert<MutableS2ShapeIndex::FaceEdge_const&>(local_38,__position,&local_a0)
            ;
          }
          else {
            puVar22 = (undefined8 *)&local_a0;
            for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
              uVar2 = *puVar22;
              (__position._M_current)->shape_id = (int)uVar2;
              (__position._M_current)->edge_id = (int)((ulong)uVar2 >> 0x20);
              puVar22 = puVar22 + (ulong)bVar24 * -2 + 1;
              __position._M_current = __position._M_current + (ulong)bVar24 * -0x10 + 8;
            }
            ppFVar1 = &(alloc->face_edges_).
                       super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppFVar1 = *ppFVar1 + 1;
          }
          lVar23 = lVar23 + 4;
          uVar21 = uVar21 - 1;
          this = local_c8;
        } while (uVar21 != 0);
      }
LAB_00193601:
      n = n + 1;
    } while (n < (*(uint *)&((S2ClippedShapeSet *)&local_b8->field_0x0)->
                            super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                 & 0xffffff));
    pFVar20 = (alloc->face_edges_).
              super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar8 = (alloc->face_edges_).
             super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_f8.c_[0] = 0.0;
    local_f8.c_[1] = 0.0;
    local_f8.c_[2] = 0.0;
    if (pFVar20 != pFVar8) {
      do {
        local_a8 = EdgeAllocator::NewClippedEdge(alloc);
        local_a8->face_edge = pFVar20;
        S2::GetClippedEdgeBound((R2Rect *)&local_a0,&pFVar20->a,&pFVar20->b,&pcell->bound_);
        (local_a8->bound).bounds_[1].bounds_.c_[0] = local_a0.a.c_[0];
        (local_a8->bound).bounds_[1].bounds_.c_[1] = local_a0.a.c_[1];
        (local_a8->bound).bounds_[0].bounds_.c_[0] = (VType)local_a0._0_8_;
        (local_a8->bound).bounds_[0].bounds_.c_[1] =
             (VType)CONCAT44(local_a0._12_4_,local_a0.max_level);
        if (local_f8.c_[1] == local_f8.c_[2]) {
          std::
          vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
          ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*const&>
                    ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                      *)&local_f8,(iterator)local_f8.c_[1],&local_a8);
        }
        else {
          *(ClippedEdge **)local_f8.c_[1] = local_a8;
          local_f8.c_[1] = (VType)((long)local_f8.c_[1] + 8);
        }
        pFVar20 = pFVar20 + 1;
      } while (pFVar20 != pFVar8);
    }
  }
  pMVar9 = local_c8;
  ppCVar16 = (edges->
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  poVar18 = (ostream *)
            (edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)poVar18 - (long)ppCVar16 != 0) {
    lVar23 = (long)poVar18 - (long)ppCVar16 >> 3;
    lVar23 = lVar23 + (ulong)(lVar23 == 0);
    ppCVar19 = ppCVar16;
    do {
      if (local_c8->pending_additions_begin_ <= (*ppCVar19)->face_edge->shape_id) {
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<MutableS2ShapeIndex::ClippedEdge_const**,std::vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>>>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)&local_f8,local_f8.c_[1]);
        ppCVar16 = (edges->
                   super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        poVar18 = (ostream *)
                  (edges->
                  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        break;
      }
      ppCVar19 = ppCVar19 + 1;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  ppCVar19 = (edges->
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (edges->
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8.c_[0];
  (edges->
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8.c_[1];
  (edges->
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8.c_[2];
  local_a0._0_8_ = (pcell->id_).id_;
  local_f8.c_[0] = (VType)ppCVar16;
  local_f8.c_[1] = (VType)poVar18;
  local_f8.c_[2] = (VType)ppCVar19;
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  ::erase_unique<S2CellId>
            ((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
              *)&pMVar9->cell_map_,(S2CellId *)&local_a0);
  pcVar10 = local_b8;
  S2ShapeIndexCell::~S2ShapeIndexCell((S2ShapeIndexCell *)local_b8);
  operator_delete(pcVar10);
  if ((pointer)local_f8.c_[0] != (pointer)0x0) {
    operator_delete((void *)local_f8.c_[0]);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::AbsorbIndexCell(const S2PaddedCell& pcell,
                                          const Iterator& iter,
                                          vector<const ClippedEdge*>* edges,
                                          InteriorTracker* tracker,
                                          EdgeAllocator* alloc) {
  S2_DCHECK_EQ(pcell.id(), iter.id());

  // When we absorb a cell, we erase all the edges that are being removed.
  // However when we are finished with this cell, we want to restore the state
  // of those edges (since that is how we find all the index cells that need
  // to be updated).  The edges themselves are restored automatically when
  // UpdateEdges returns from its recursive call, but the InteriorTracker
  // state needs to be restored explicitly.
  //
  // Here we first update the InteriorTracker state for removed edges to
  // correspond to the exit vertex of this cell, and then save the
  // InteriorTracker state.  This state will be restored by UpdateEdges when
  // it is finished processing the contents of this cell.
  if (tracker->is_active() && !edges->empty() &&
      is_shape_being_removed((*edges)[0]->face_edge->shape_id)) {
    // We probably need to update the InteriorTracker.  ("Probably" because
    // it's possible that all shapes being removed do not have interiors.)
    if (!tracker->at_cellid(pcell.id())) {
      tracker->MoveTo(pcell.GetEntryVertex());
    }
    tracker->DrawTo(pcell.GetExitVertex());
    tracker->set_next_cellid(pcell.id().next());
    for (const ClippedEdge* edge : *edges) {
      const FaceEdge* face_edge = edge->face_edge;
      if (!is_shape_being_removed(face_edge->shape_id)) {
        break;  // All shapes being removed come first.
      }
      if (face_edge->has_interior) {
        tracker->TestEdge(face_edge->shape_id, face_edge->edge);
      }
    }
  }
  // Save the state of the edges being removed, so that it can be restored
  // when we are finished processing this cell and its children.  We don't
  // need to save the state of the edges being added because they aren't being
  // removed from "edges" and will therefore be updated normally as we visit
  // this cell and its children.
  tracker->SaveAndClearStateBefore(pending_additions_begin_);

  // Create a FaceEdge for each edge in this cell that isn't being removed.
  vector<FaceEdge>* face_edges = alloc->mutable_face_edges();
  face_edges->clear();
  bool tracker_moved = false;
  const S2ShapeIndexCell& cell = iter.cell();
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    int shape_id = clipped.shape_id();
    const S2Shape* shape = this->shape(shape_id);
    if (shape == nullptr) continue;  // This shape is being removed.
    int num_edges = clipped.num_edges();

    // If this shape has an interior, start tracking whether we are inside the
    // shape.  UpdateEdges() wants to know whether the entry vertex of this
    // cell is inside the shape, but we only know whether the center of the
    // cell is inside the shape, so we need to test all the edges against the
    // line segment from the cell center to the entry vertex.
    FaceEdge edge;
    edge.shape_id = shape->id();
    edge.has_interior = (shape->dimension() == 2);
    if (edge.has_interior) {
      tracker->AddShape(shape_id, clipped.contains_center());
      // There might not be any edges in this entire cell (i.e., it might be
      // in the interior of all shapes), so we delay updating the tracker
      // until we see the first edge.
      if (!tracker_moved && num_edges > 0) {
        tracker->MoveTo(pcell.GetCenter());
        tracker->DrawTo(pcell.GetEntryVertex());
        tracker->set_next_cellid(pcell.id());
        tracker_moved = true;
      }
    }
    for (int i = 0; i < num_edges; ++i) {
      int e = clipped.edge(i);
      edge.edge_id = e;
      edge.edge = shape->edge(e);
      edge.max_level = GetEdgeMaxLevel(edge.edge);
      if (edge.has_interior) tracker->TestEdge(shape_id, edge.edge);
      if (!S2::ClipToPaddedFace(edge.edge.v0, edge.edge.v1, pcell.id().face(),
                                kCellPadding, &edge.a, &edge.b)) {
        S2_LOG(DFATAL) << "Invariant failure in MutableS2ShapeIndex";
      }
      face_edges->push_back(edge);
    }
  }
  // Now create a ClippedEdge for each FaceEdge, and put them in "new_edges".
  vector<const ClippedEdge*> new_edges;
  for (const FaceEdge& face_edge : *face_edges) {
    ClippedEdge* clipped = alloc->NewClippedEdge();
    clipped->face_edge = &face_edge;
    clipped->bound = S2::GetClippedEdgeBound(face_edge.a, face_edge.b,
                                                     pcell.bound());
    new_edges.push_back(clipped);
  }
  // Discard any edges from "edges" that are being removed, and append the
  // remainder to "new_edges".  (This keeps the edges sorted by shape id.)
  for (int i = 0; i < edges->size(); ++i) {
    const ClippedEdge* clipped = (*edges)[i];
    if (!is_shape_being_removed(clipped->face_edge->shape_id)) {
      new_edges.insert(new_edges.end(), edges->begin() + i, edges->end());
      break;
    }
  }
  // Update the edge list and delete this cell from the index.
  edges->swap(new_edges);
  cell_map_.erase(pcell.id());
  delete &cell;
}